

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

void __thiscall
cs_impl::
cni_holder<const_char_*(cni_root_namespace::child::foo::*)(const_char_*),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(cni_root_namespace::child::foo_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
::cni_holder(cni_holder<const_char_*(cni_root_namespace::child::foo::*)(const_char_*),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(cni_root_namespace::child::foo_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *this,offset_in_foo_to_subr *func)

{
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  (this->super_cni_holder_base)._vptr_cni_holder_base = (_func_int **)&PTR__cni_holder_00377a88;
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  if ((void *)*func != (void *)0x0) {
    local_28._8_8_ = func[1];
    pcStack_10 = std::
                 _Function_handler<const_char_*(cni_root_namespace::child::foo_&,_const_char_*),_const_char_*(cni_root_namespace::child::foo::*)(const_char_*)>
                 ::_M_invoke;
    local_18 = std::
               _Function_handler<const_char_*(cni_root_namespace::child::foo_&,_const_char_*),_const_char_*(cni_root_namespace::child::foo::*)(const_char_*)>
               ::_M_manager;
    local_28._M_unused._M_object = (void *)*func;
  }
  std::function<const_char_*(cni_root_namespace::child::foo_&,_const_char_*)>::function
            (&(this->mCni).mFunc,
             (function<const_char_*(cni_root_namespace::child::foo_&,_const_char_*)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}